

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLib.h
# Opt level: O1

void Abc_SclLibFree(SC_Lib *p)

{
  undefined8 *puVar1;
  void **ppvVar2;
  void *pvVar3;
  undefined8 *__ptr;
  undefined8 *__ptr_00;
  undefined8 *__ptr_01;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  if (0 < (p->vWireLoads).nSize) {
    lVar4 = 0;
    do {
      puVar1 = (undefined8 *)(p->vWireLoads).pArray[lVar4];
      if ((void *)puVar1[3] != (void *)0x0) {
        free((void *)puVar1[3]);
        puVar1[3] = 0;
      }
      puVar1[2] = 0;
      if ((void *)puVar1[5] != (void *)0x0) {
        free((void *)puVar1[5]);
        puVar1[5] = 0;
      }
      puVar1[4] = 0;
      if ((void *)*puVar1 != (void *)0x0) {
        free((void *)*puVar1);
        *puVar1 = 0;
      }
      free(puVar1);
      lVar4 = lVar4 + 1;
    } while (lVar4 < (p->vWireLoads).nSize);
  }
  ppvVar2 = (p->vWireLoads).pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
    (p->vWireLoads).pArray = (void **)0x0;
  }
  (p->vWireLoads).nCap = 0;
  (p->vWireLoads).nSize = 0;
  if (0 < (p->vWireLoadSels).nSize) {
    lVar4 = 0;
    do {
      puVar1 = (undefined8 *)(p->vWireLoadSels).pArray[lVar4];
      if ((void *)puVar1[2] != (void *)0x0) {
        free((void *)puVar1[2]);
        puVar1[2] = 0;
      }
      puVar1[1] = 0;
      if ((void *)puVar1[4] != (void *)0x0) {
        free((void *)puVar1[4]);
        puVar1[4] = 0;
      }
      puVar1[3] = 0;
      if (0 < *(int *)((long)puVar1 + 0x2c)) {
        lVar7 = 0;
        do {
          pvVar3 = *(void **)(puVar1[6] + lVar7 * 8);
          if ((void *)0x2 < pvVar3) {
            free(pvVar3);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < *(int *)((long)puVar1 + 0x2c));
      }
      if ((void *)*puVar1 != (void *)0x0) {
        free((void *)*puVar1);
        *puVar1 = 0;
      }
      free(puVar1);
      lVar4 = lVar4 + 1;
    } while (lVar4 < (p->vWireLoadSels).nSize);
  }
  ppvVar2 = (p->vWireLoadSels).pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
    (p->vWireLoadSels).pArray = (void **)0x0;
  }
  (p->vWireLoadSels).nCap = 0;
  (p->vWireLoadSels).nSize = 0;
  if (0 < (p->vTempls).nSize) {
    lVar4 = 0;
    do {
      puVar1 = (undefined8 *)(p->vTempls).pArray[lVar4];
      if (0 < *(int *)((long)puVar1 + 0xc)) {
        lVar7 = 0;
        do {
          pvVar3 = *(void **)(puVar1[2] + lVar7 * 8);
          if ((void *)0x2 < pvVar3) {
            free(pvVar3);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < *(int *)((long)puVar1 + 0xc));
      }
      if (0 < *(int *)((long)puVar1 + 0x1c)) {
        lVar7 = 0;
        do {
          pvVar3 = *(void **)(puVar1[4] + lVar7 * 8);
          if (pvVar3 != (void *)0x0) {
            if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
              free(*(void **)((long)pvVar3 + 8));
              *(undefined8 *)((long)pvVar3 + 8) = 0;
            }
            free(pvVar3);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < *(int *)((long)puVar1 + 0x1c));
      }
      if ((void *)puVar1[4] != (void *)0x0) {
        free((void *)puVar1[4]);
        puVar1[4] = 0;
      }
      puVar1[3] = 0;
      if ((void *)*puVar1 != (void *)0x0) {
        free((void *)*puVar1);
        *puVar1 = 0;
      }
      free(puVar1);
      lVar4 = lVar4 + 1;
    } while (lVar4 < (p->vTempls).nSize);
  }
  ppvVar2 = (p->vTempls).pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
    (p->vTempls).pArray = (void **)0x0;
  }
  (p->vTempls).nCap = 0;
  (p->vTempls).nSize = 0;
  if (0 < (p->vCells).nSize) {
    lVar4 = 0;
    do {
      puVar1 = (undefined8 *)(p->vCells).pArray[lVar4];
      if (0 < *(int *)((long)puVar1 + 0x34)) {
        lVar7 = 0;
        do {
          __ptr = *(undefined8 **)(puVar1[7] + lVar7 * 8);
          if (0 < *(int *)((long)__ptr + 0x44)) {
            lVar5 = 0;
            do {
              __ptr_00 = *(undefined8 **)(__ptr[9] + lVar5 * 8);
              if (0 < *(int *)((long)__ptr_00 + 0xc)) {
                lVar6 = 0;
                do {
                  __ptr_01 = *(undefined8 **)(__ptr_00[2] + lVar6 * 8);
                  Abc_SclSurfaceFree((SC_Surface *)(__ptr_01 + 3));
                  Abc_SclSurfaceFree((SC_Surface *)(__ptr_01 + 0x19));
                  Abc_SclSurfaceFree((SC_Surface *)(__ptr_01 + 0x2f));
                  Abc_SclSurfaceFree((SC_Surface *)(__ptr_01 + 0x45));
                  if ((void *)*__ptr_01 != (void *)0x0) {
                    free((void *)*__ptr_01);
                    *__ptr_01 = 0;
                  }
                  if ((void *)__ptr_01[2] != (void *)0x0) {
                    free((void *)__ptr_01[2]);
                    __ptr_01[2] = 0;
                  }
                  free(__ptr_01);
                  lVar6 = lVar6 + 1;
                } while (lVar6 < *(int *)((long)__ptr_00 + 0xc));
              }
              if ((void *)__ptr_00[2] != (void *)0x0) {
                free((void *)__ptr_00[2]);
                __ptr_00[2] = 0;
              }
              __ptr_00[1] = 0;
              if ((void *)*__ptr_00 != (void *)0x0) {
                free((void *)*__ptr_00);
                *__ptr_00 = 0;
              }
              free(__ptr_00);
              lVar5 = lVar5 + 1;
            } while (lVar5 < *(int *)((long)__ptr + 0x44));
          }
          if ((void *)__ptr[9] != (void *)0x0) {
            free((void *)__ptr[9]);
            __ptr[9] = 0;
          }
          __ptr[8] = 0;
          if ((void *)__ptr[7] != (void *)0x0) {
            free((void *)__ptr[7]);
            __ptr[7] = 0;
          }
          __ptr[6] = 0;
          if ((void *)__ptr[5] != (void *)0x0) {
            free((void *)__ptr[5]);
            __ptr[5] = 0;
          }
          if ((void *)*__ptr != (void *)0x0) {
            free((void *)*__ptr);
            *__ptr = 0;
          }
          free(__ptr);
          lVar7 = lVar7 + 1;
        } while (lVar7 < *(int *)((long)puVar1 + 0x34));
      }
      if ((void *)puVar1[7] != (void *)0x0) {
        free((void *)puVar1[7]);
        puVar1[7] = 0;
      }
      puVar1[6] = 0;
      if ((void *)*puVar1 != (void *)0x0) {
        free((void *)*puVar1);
        *puVar1 = 0;
      }
      free(puVar1);
      lVar4 = lVar4 + 1;
    } while (lVar4 < (p->vCells).nSize);
  }
  ppvVar2 = (p->vCells).pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
    (p->vCells).pArray = (void **)0x0;
  }
  (p->vCells).nCap = 0;
  (p->vCells).nSize = 0;
  ppvVar2 = (p->vCellClasses).pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
    (p->vCellClasses).pArray = (void **)0x0;
  }
  (p->vCellClasses).nCap = 0;
  (p->vCellClasses).nSize = 0;
  if (p->pName != (char *)0x0) {
    free(p->pName);
    p->pName = (char *)0x0;
  }
  if (p->pFileName != (char *)0x0) {
    free(p->pFileName);
    p->pFileName = (char *)0x0;
  }
  if (p->default_wire_load != (char *)0x0) {
    free(p->default_wire_load);
    p->default_wire_load = (char *)0x0;
  }
  if (p->default_wire_load_sel != (char *)0x0) {
    free(p->default_wire_load_sel);
    p->default_wire_load_sel = (char *)0x0;
  }
  if (p->pBins != (int *)0x0) {
    free(p->pBins);
    p->pBins = (int *)0x0;
  }
  free(p);
  return;
}

Assistant:

static inline void Abc_SclLibFree( SC_Lib * p )
{
    SC_WireLoad * pWL;
    SC_WireLoadSel * pWLS;
    SC_TableTempl * pTempl;
    SC_Cell * pCell;
    int i;
    SC_LibForEachWireLoad( p, pWL, i )
        Abc_SclWireLoadFree( pWL );
    Vec_PtrErase( &p->vWireLoads );
    SC_LibForEachWireLoadSel( p, pWLS, i )
        Abc_SclWireLoadSelFree( pWLS );
    Vec_PtrErase( &p->vWireLoadSels );
    SC_LibForEachTempl( p, pTempl, i )
        Abc_SclTableTemplFree( pTempl );
    Vec_PtrErase( &p->vTempls );
    SC_LibForEachCell( p, pCell, i )
        Abc_SclCellFree( pCell );
    Vec_PtrErase( &p->vCells );
    Vec_PtrErase( &p->vCellClasses );
    ABC_FREE( p->pName );
    ABC_FREE( p->pFileName );
    ABC_FREE( p->default_wire_load );
    ABC_FREE( p->default_wire_load_sel );
    ABC_FREE( p->pBins );
    ABC_FREE( p );
}